

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector.c
# Opt level: O0

int N_VConstVectorArray(int nvec,realtype c,N_Vector *Z)

{
  int local_24;
  int ier;
  int i;
  N_Vector *Z_local;
  realtype c_local;
  int nvec_local;
  
  if ((*Z)->ops->nvconstvectorarray == (_func_int_int_realtype_N_Vector_ptr *)0x0) {
    for (local_24 = 0; local_24 < nvec; local_24 = local_24 + 1) {
      (*(*Z)->ops->nvconst)(c,Z[local_24]);
    }
    c_local._4_4_ = 0;
  }
  else {
    c_local._4_4_ = (*(*Z)->ops->nvconstvectorarray)(nvec,c,Z);
  }
  return c_local._4_4_;
}

Assistant:

int N_VConstVectorArray(int nvec, realtype c, N_Vector* Z)
{
  int i, ier;

  if (Z[0]->ops->nvconstvectorarray != NULL) {
    
    ier = Z[0]->ops->nvconstvectorarray(nvec, c, Z);
    return(ier);

  } else {

    for (i=0; i<nvec; i++) {
      Z[0]->ops->nvconst(c, Z[i]);
    }
    return(0);

  }
}